

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

bool __thiscall
absl::numbers_internal::safe_strtou128_base
          (numbers_internal *this,string_view text,Nonnull<uint128_*> value,int base)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [16];
  ulong uVar5;
  ulong uVar6;
  numbers_internal *pnVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  uint128 other;
  bool local_81;
  undefined1 (*local_80) [16];
  uint128 local_78;
  uint local_5c;
  ulong local_58;
  numbers_internal *local_50;
  ulong local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  pauVar4 = (undefined1 (*) [16])text._M_str;
  local_40._M_str = (char *)text._M_len;
  local_5c = (uint)value;
  *pauVar4 = (undefined1  [16])0x0;
  local_40._M_len = (size_t)this;
  bVar2 = anon_unknown_0::safe_parse_sign_and_base(&local_40,(Nonnull<int_*>)&local_5c,&local_81);
  pnVar7 = (numbers_internal *)local_40._M_str;
  if ((bVar2) && (local_81 == false)) {
    local_50 = (numbers_internal *)local_40._M_len;
    local_58 = (ulong)(int)local_5c;
    local_78.lo_ = 0;
    local_78.hi_ = 0;
    if ((long)local_58 < 0) {
      __assert_fail("base >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                    ,0x3da,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = absl::uint128]"
                   );
    }
    auVar9 = *(undefined1 (*) [16])
              ((anonymous_namespace)::LookupTables<absl::uint128>::kVmaxOverBase + local_58 * 0x10);
    auVar1 = *(undefined1 (*) [16])
              ((anonymous_namespace)::LookupTables<absl::uint128>::kVmaxOverBase + local_58 * 0x10);
    local_80 = pauVar4;
    if ((1 < local_5c) &&
       (auVar9 = __udivti3(0xffffffffffffffff,0xffffffffffffffff,local_58), auVar9 != auVar1)) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                    ,0x3df,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = absl::uint128]"
                   );
    }
    local_50 = local_50 + (long)pnVar7;
    uVar6 = 0;
    local_48 = (long)local_58 >> 0x3f;
    uVar3 = 0;
    for (; bVar2 = local_50 <= pnVar7, !bVar2; pnVar7 = pnVar7 + 1) {
      uVar8 = (ulong)(char)(anonymous_namespace)::kAsciiToInt[(byte)*pnVar7];
      uVar5 = (ulong)((char)(anonymous_namespace)::kAsciiToInt[(byte)*pnVar7] >> 7);
      if (local_48 <= uVar5 && (ulong)(uVar8 < local_58) <= uVar5 - local_48) break;
      if (auVar9._8_8_ < uVar6 || auVar9._8_8_ - uVar6 < (ulong)(auVar9._0_8_ < uVar3)) {
LAB_00242f1f:
        local_78.hi_._4_4_ = 0xffffffff;
        local_78.lo_._0_4_ = 0xffffffff;
        local_78.lo_._4_4_ = 0xffffffff;
        local_78.hi_._0_4_ = 0xffffffff;
        goto LAB_00242f23;
      }
      other.hi_ = 0;
      other.lo_ = local_58;
      uint128::operator*=(&local_78,other);
      if (~uVar5 < local_78.hi_ || ~uVar5 - local_78.hi_ < (ulong)(~uVar8 < local_78.lo_))
      goto LAB_00242f1f;
      uVar3 = local_78.lo_ + uVar8;
      uVar6 = uVar5 + local_78.hi_ + (ulong)CARRY8(local_78.lo_,uVar8);
      local_78.hi_ = uVar6;
      local_78.lo_ = uVar3;
    }
LAB_00242f23:
    *(undefined4 *)*local_80 = (undefined4)local_78.lo_;
    *(undefined4 *)(*local_80 + 4) = local_78.lo_._4_4_;
    *(undefined4 *)(*local_80 + 8) = (undefined4)local_78.hi_;
    *(undefined4 *)(*local_80 + 0xc) = local_78.hi_._4_4_;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool safe_strtou128_base(absl::string_view text, absl::Nonnull<uint128*> value,
                         int base) {
  return safe_uint_internal<absl::uint128>(text, value, base);
}